

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuCreate.c
# Opt level: O1

void Fxu_CreateCovers(Fxu_Matrix *p,Fxu_Data_t *pData)

{
  int iVar1;
  Fxu_Lit *pFVar2;
  int iVar3;
  Fxu_Var **ppFVar4;
  uint uVar5;
  Fxu_Cube *pCubeFirst;
  ulong uVar6;
  long lVar7;
  Fxu_Cube *pFVar8;
  int iVar9;
  long lVar10;
  long *plVar11;
  long lVar12;
  Fxu_Cube *pFVar13;
  int iVar14;
  long lVar15;
  
  uVar5 = pData->nNodesNew + pData->nNodesOld;
  if (uVar5 != 0 && SCARRY4(pData->nNodesNew,pData->nNodesOld) == (int)uVar5 < 0) {
    uVar6 = (ulong)uVar5;
    ppFVar4 = p->ppVars + 1;
    do {
      pCubeFirst = (*ppFVar4)->pFirst;
      if (pCubeFirst != (Fxu_Cube *)0x0) goto LAB_004b88ba;
      ppFVar4 = ppFVar4 + 2;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  pCubeFirst = (Fxu_Cube *)0x0;
LAB_004b88ba:
  uVar6 = (ulong)(uint)pData->nNodesOld;
  if (0 < pData->nNodesOld) {
    lVar15 = -1;
    lVar10 = 0x18;
    lVar12 = 0;
    do {
      pFVar13 = pCubeFirst;
      if (pData->vSops->pArray[lVar12] != (void *)0x0) {
        iVar3 = (int)uVar6;
        if (lVar12 + 1 < (long)pData->nNodesNew + (long)iVar3) {
          lVar7 = iVar3 + lVar15 + (long)pData->nNodesNew;
          plVar11 = (long *)((long)p->ppVars + lVar10);
          do {
            pFVar13 = *(Fxu_Cube **)(*plVar11 + 8);
            if (pFVar13 != (Fxu_Cube *)0x0) goto LAB_004b891d;
            plVar11 = plVar11 + 2;
            lVar7 = lVar7 + -1;
          } while (lVar7 != 0);
        }
        pFVar13 = (Fxu_Cube *)0x0;
LAB_004b891d:
        if (pCubeFirst != pFVar13) {
          pFVar8 = pCubeFirst;
          do {
            pFVar2 = (pFVar8->lLits).pTail;
            if ((pFVar2 != (Fxu_Lit *)0x0) &&
               (iVar9 = pFVar2->iVar, SBORROW4(iVar9,iVar3 * 2) == iVar9 + iVar3 * -2 < 0)) {
              Fxu_CreateCoversNode(p,pData,(int)lVar12,pCubeFirst,pFVar13);
              break;
            }
            pFVar8 = pFVar8->pNext;
          } while (pFVar8 != pFVar13);
        }
      }
      pCubeFirst = pFVar13;
      lVar12 = lVar12 + 1;
      uVar6 = (ulong)pData->nNodesOld;
      lVar15 = lVar15 + -1;
      lVar10 = lVar10 + 0x10;
    } while (lVar12 < (long)uVar6);
  }
  iVar3 = pData->nNodesNew;
  if (0 < iVar3) {
    iVar14 = 0;
    iVar9 = 1;
    do {
      iVar1 = pData->nNodesOld;
      if (iVar1 + iVar14 + 1 < iVar1 + iVar3) {
        lVar10 = ((long)iVar3 + (long)iVar1) - (long)(iVar1 + iVar9);
        ppFVar4 = p->ppVars + (long)(iVar1 + iVar9) * 2 + 1;
        do {
          pFVar13 = (*ppFVar4)->pFirst;
          if (pFVar13 != (Fxu_Cube *)0x0) goto LAB_004b89ca;
          ppFVar4 = ppFVar4 + 2;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
      }
      pFVar13 = (Fxu_Cube *)0x0;
LAB_004b89ca:
      Fxu_CreateCoversNode(p,pData,iVar1 + iVar14,pCubeFirst,pFVar13);
      iVar14 = iVar14 + 1;
      iVar3 = pData->nNodesNew;
      iVar9 = iVar9 + 1;
      pCubeFirst = pFVar13;
    } while (iVar14 < iVar3);
  }
  return;
}

Assistant:

void Fxu_CreateCovers( Fxu_Matrix * p, Fxu_Data_t * pData )
{
    Fxu_Cube * pCube, * pCubeFirst, * pCubeNext;
    char * pSopCover;
    int iNode, n;

    // get the first cube of the first internal node 
    pCubeFirst = Fxu_CreateCoversFirstCube( p, pData, 0 );

    // go through the internal nodes
    for ( n = 0; n < pData->nNodesOld; n++ )
    if ( (pSopCover = (char *)pData->vSops->pArray[n]) )
    {
        // get the number of this node
        iNode = n;
        // get the next first cube
        pCubeNext = Fxu_CreateCoversFirstCube(  p, pData, iNode + 1 );
        // check if there any new variables in these cubes
        for ( pCube = pCubeFirst; pCube != pCubeNext; pCube = pCube->pNext )
            if ( pCube->lLits.pTail && pCube->lLits.pTail->iVar >= 2 * pData->nNodesOld )
                break;
        if ( pCube != pCubeNext )
            Fxu_CreateCoversNode( p, pData, iNode, pCubeFirst, pCubeNext );
        // update the first cube
        pCubeFirst = pCubeNext;
    }

    // add the covers for the extracted nodes
    for ( n = 0; n < pData->nNodesNew; n++ )
    {
        // get the number of this node
        iNode = pData->nNodesOld + n;
        // get the next first cube
        pCubeNext = Fxu_CreateCoversFirstCube( p, pData, iNode + 1 );
        // the node should be added
        Fxu_CreateCoversNode( p, pData, iNode, pCubeFirst, pCubeNext );
        // update the first cube
        pCubeFirst = pCubeNext;
    }
}